

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O1

tmsize_t TIFFReadRawStrip1(TIFF *tif,uint32_t strip,void *buf,tmsize_t size,char *module)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint64_t uVar4;
  tmsize_t tVar5;
  long lVar6;
  
  uVar1 = tif->tif_flags;
  if ((uVar1 >> 0x11 & 1) != 0) {
    __assert_fail("(tif->tif_flags & TIFF_NOREADRAW) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                  ,599,
                  "tmsize_t TIFFReadRawStrip1(TIFF *, uint32_t, void *, tmsize_t, const char *)");
  }
  uVar4 = TIFFGetStrileOffset(tif,strip);
  if ((uVar1 >> 0xb & 1) == 0) {
    iVar3 = _TIFFSeekOK(tif,uVar4);
    if (iVar3 == 0) {
      TIFFErrorExtR(tif,module,"Seek error at scanline %u, strip %u",(ulong)tif->tif_row,strip);
    }
    else {
      tVar5 = (*tif->tif_readproc)(tif->tif_clientdata,buf,size);
      if (tVar5 == size) {
        return size;
      }
      TIFFErrorExtR(tif,module,"Read error at scanline %u; got %ld bytes, expected %ld",
                    (ulong)tif->tif_row,tVar5,size);
    }
    return -1;
  }
  if ((long)uVar4 < 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = TIFFGetStrileOffset(tif,strip);
    lVar2 = tif->tif_size;
    if ((long)uVar4 <= (long)(size ^ 0x7fffffffffffffffU) && (long)uVar4 <= lVar2) {
      lVar6 = lVar2 - uVar4;
      if ((long)(uVar4 + size) <= lVar2) {
        lVar6 = size;
      }
      goto LAB_002b558f;
    }
  }
  lVar6 = 0;
LAB_002b558f:
  if (lVar6 == size) {
    _TIFFmemcpy(buf,tif->tif_base + uVar4,size);
    return size;
  }
  TIFFErrorExtR(tif,module,"Read error at scanline %u, strip %u; got %ld bytes, expected %ld",
                (ulong)tif->tif_row,strip,lVar6,size);
  return -1;
}

Assistant:

static tmsize_t TIFFReadRawStrip1(TIFF *tif, uint32_t strip, void *buf,
                                  tmsize_t size, const char *module)
{
    assert((tif->tif_flags & TIFF_NOREADRAW) == 0);
    if (!isMapped(tif))
    {
        tmsize_t cc;

        if (!SeekOK(tif, TIFFGetStrileOffset(tif, strip)))
        {
            TIFFErrorExtR(tif, module,
                          "Seek error at scanline %" PRIu32 ", strip %" PRIu32,
                          tif->tif_row, strip);
            return ((tmsize_t)(-1));
        }
        cc = TIFFReadFile(tif, buf, size);
        if (cc != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at scanline %" PRIu32
                          "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, cc, size);
            return ((tmsize_t)(-1));
        }
    }
    else
    {
        tmsize_t ma = 0;
        tmsize_t n;
        if ((TIFFGetStrileOffset(tif, strip) > (uint64_t)TIFF_TMSIZE_T_MAX) ||
            ((ma = (tmsize_t)TIFFGetStrileOffset(tif, strip)) > tif->tif_size))
        {
            n = 0;
        }
        else if (ma > TIFF_TMSIZE_T_MAX - size)
        {
            n = 0;
        }
        else
        {
            tmsize_t mb = ma + size;
            if (mb > tif->tif_size)
                n = tif->tif_size - ma;
            else
                n = size;
        }
        if (n != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at scanline %" PRIu32 ", strip %" PRIu32
                          "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, strip, n, size);
            return ((tmsize_t)(-1));
        }
        _TIFFmemcpy(buf, tif->tif_base + ma, size);
    }
    return (size);
}